

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.cpp
# Opt level: O1

void Am_Cleanup(void)

{
  if (Am_Initialized_Flag == '\x01') {
    Am_Demon_Queue::Shutdown(&Main_Demon_Queue);
    Am_State_Store::shutdown = true;
    Am_Object::Destroy(&Am_Group);
    Am_Object::Destroy(&Am_Aggregate);
    Am_Object::Destroy(&Am_Window);
    Am_Object::Destroy(&Am_Screen);
    Am_Object::Destroy(&Am_Menu_Bar_Sub_Window_Proto);
    Am_Object::Destroy(&Am_Graphical_Object);
    Am_Initializer::Do_Cleanup();
    Am_Object::Destroy(&Am_Root_Object);
    Am_Initialized_Flag = '\0';
  }
  return;
}

Assistant:

void
Am_Cleanup()
{
  if (!Am_Initialized_Flag)
    return;

  Main_Demon_Queue.Shutdown();
  Am_State_Store::Shutdown();

#ifdef DEBUG
  Am_Global_Slot_Trace_Proc = nullptr;
#endif

  Am_Group.Destroy();
  Am_Aggregate.Destroy();
  Am_Window.Destroy();
  Am_Screen.Destroy();

  // Destroy prototypes
  //	item_prototype.Destroy();
  Am_Menu_Bar_Sub_Window_Proto.Destroy(); // see button_widgets.cpp ~line 3712

  // NDY: Make sure these are released -- in order -- once defined.
  // 	Am_Polygon.Destroy ();
  Am_Graphical_Object.Destroy();

  // ---------------------------------------------------------------------------
  // we cleanup stuff allocated once in the complete OpenAmulet environment, too (still buggy!)
  // ---------------------------------------------------------------------------

  // Am_Slot_Key_Table is allocated in file standard_slot.cpp function verify_slot_name_key_table()
  //	delete(Am_Slot_Name_Key_Table);

  // these both maps are defined in gem_keytrans.cpp
  //	delete(char_map);
  //	delete(click_count_map);

  // call any registered cleanup procedure
  Am_Initializer::Do_Cleanup();

  // finally destroy our root
  Am_Root_Object.Destroy();

  Am_Initialized_Flag = 0;
}